

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O1

MessageStore * __thiscall
FIX::MemoryStoreFactory::create(MemoryStoreFactory *this,UtcTimeStamp *now,SessionID *param_2)

{
  _func_int **pp_Var1;
  MessageStore *pMVar2;
  
  pMVar2 = (MessageStore *)operator_new(0x60);
  pMVar2->_vptr_MessageStore = (_func_int **)&PTR__MemoryStore_001f9570;
  *(undefined4 *)&pMVar2[2]._vptr_MessageStore = 0;
  pMVar2[3]._vptr_MessageStore = (_func_int **)0x0;
  pMVar2[4]._vptr_MessageStore = (_func_int **)(pMVar2 + 2);
  pMVar2[5]._vptr_MessageStore = (_func_int **)(pMVar2 + 2);
  pMVar2[6]._vptr_MessageStore = (_func_int **)0x0;
  pMVar2[7]._vptr_MessageStore = (_func_int **)0x1;
  pMVar2[8]._vptr_MessageStore = (_func_int **)0x1;
  pMVar2[9]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001f8600;
  pp_Var1 = (_func_int **)(now->super_DateTime).m_time;
  pMVar2[10]._vptr_MessageStore = *(_func_int ***)&(now->super_DateTime).m_date;
  pMVar2[0xb]._vptr_MessageStore = pp_Var1;
  pMVar2[9]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001f8898;
  return pMVar2;
}

Assistant:

MessageStore *MemoryStoreFactory::create(const UtcTimeStamp &now, const SessionID &) { return new MemoryStore(now); }